

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O2

int dumbfile_mem_skip(void *f,long n)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = (int)n + *(int *)((long)f + 8);
  uVar1 = *(uint *)((long)f + 0xc);
  uVar3 = uVar2;
  if (uVar1 <= uVar2) {
    uVar3 = uVar1;
  }
  *(uint *)((long)f + 8) = uVar3;
  return (int)(uVar1 < uVar2);
}

Assistant:

static int DUMBCALLBACK dumbfile_mem_skip(void *f, long n)
{
	dumbfile_mem_status * s = (dumbfile_mem_status *) f;
	s->offset += n;
	if (s->offset > s->size)
	{
		s->offset = s->size;
		return 1;
	}
	return 0;
}